

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::SourceInfoTest_DocCommentsTopLevel_Test::TestBody
          (SourceInfoTest_DocCommentsTopLevel_Test *this)

{
  FileDescriptorProto *descriptor_proto;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *in_R9;
  char *pcVar2;
  pointer *__ptr_4;
  pointer *__ptr;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string local_40;
  
  local_50[0] = (internal)
                SourceInfoTest::Parse
                          (&this->super_SourceInfoTest,
                           "// detached before syntax paragraph 1\n\n// detached before syntax paragraph 2\n\n// syntax leading\n$a$syntax = \"proto2\";$b$\n// syntax trailing\n\n// syntax-package detached comments\n\n;\n\n// detached after empty before package\n\n// package leading\n$c$package foo;$d$\n// package trailing\n\n// ignored detach\n\n"
                          );
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_50[0]) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_50,
               (AssertionResult *)
               "Parse(\"// detached before syntax paragraph 1\\n\" \"\\n\" \"// detached before syntax paragraph 2\\n\" \"\\n\" \"// syntax leading\\n\" \"$a$syntax = \\\"proto2\\\";$b$\\n\" \"// syntax trailing\\n\" \"\\n\" \"// syntax-package detached comments\\n\" \"\\n\" \";\\n\" \"\\n\" \"// detached after empty before package\\n\" \"\\n\" \"// package leading\\n\" \"$c$package foo;$d$\\n\" \"// package trailing\\n\" \"\\n\" \"// ignored detach\\n\" \"\\n\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0x102c,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"syntax","");
  descriptor_proto = &(this->super_SourceInfoTest).file_;
  pcVar2 = &DAT_ffffffff;
  local_50[0] = (internal)
                SourceInfoTest::HasSpan
                          (&this->super_SourceInfoTest,'a','b',&descriptor_proto->super_Message,
                           &local_40,-1," syntax leading\n"," syntax trailing\n",
                           " detached before syntax paragraph 1\n\n detached before syntax paragraph 2\n"
                          );
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar1) {
    if (!(bool)local_50[0]) goto LAB_00ab7788;
  }
  else {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    if (((byte)local_50[0] & 1) == 0) {
LAB_00ab7788:
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,local_50,
                 (AssertionResult *)
                 "HasSpan(\'a\', \'b\', file_, \"syntax\", -1, \" syntax leading\\n\", \" syntax trailing\\n\", \" detached before syntax paragraph 1\\n\" \"\\n\" \" detached before syntax paragraph 2\\n\")"
                 ,"false","true",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                 ,0x1032,local_40._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"package","");
  pcVar2 = &DAT_ffffffff;
  local_50[0] = (internal)
                SourceInfoTest::HasSpan
                          (&this->super_SourceInfoTest,'c','d',&descriptor_proto->super_Message,
                           &local_40,-1," package leading\n"," package trailing\n",
                           " syntax-package detached comments\n\n detached after empty before package\n"
                          );
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar1) {
    if ((bool)local_50[0]) goto LAB_00ab794e;
  }
  else {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    if (((byte)local_50[0] & 1) != 0) goto LAB_00ab794e;
  }
  testing::Message::Message((Message *)&local_58);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_40,local_50,
             (AssertionResult *)
             "HasSpan(\'c\', \'d\', file_, \"package\", -1, \" package leading\\n\", \" package trailing\\n\", \" syntax-package detached comments\\n\" \"\\n\" \" detached after empty before package\\n\")"
             ,"false","true",pcVar2);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
             ,0x1037,local_40._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
LAB_00ab794e:
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  pcVar2 = &DAT_ffffffff;
  local_50[0] = (internal)
                SourceInfoTest::HasSpanWithComment
                          (&this->super_SourceInfoTest,'\0','\0',&descriptor_proto->super_Message,
                           (FieldDescriptor *)0x0,-1,(char *)0x0,(char *)0x0,(char *)0x0);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_50[0]) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,local_50,(AssertionResult *)"HasSpan(file_)","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0x103a,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  return;
}

Assistant:

TEST_F(SourceInfoTest, DocCommentsTopLevel) {
  EXPECT_TRUE(
      Parse("// detached before syntax paragraph 1\n"
            "\n"
            "// detached before syntax paragraph 2\n"
            "\n"
            "// syntax leading\n"
            "$a$syntax = \"proto2\";$b$\n"
            "// syntax trailing\n"
            "\n"
            "// syntax-package detached comments\n"
            "\n"
            ";\n"
            "\n"
            "// detached after empty before package\n"
            "\n"
            "// package leading\n"
            "$c$package foo;$d$\n"
            "// package trailing\n"
            "\n"
            "// ignored detach\n"
            "\n"));

  EXPECT_TRUE(HasSpan('a', 'b', file_, "syntax", -1, " syntax leading\n",
                      " syntax trailing\n",
                      " detached before syntax paragraph 1\n"
                      "\n"
                      " detached before syntax paragraph 2\n"));
  EXPECT_TRUE(HasSpan('c', 'd', file_, "package", -1, " package leading\n",
                      " package trailing\n",
                      " syntax-package detached comments\n"
                      "\n"
                      " detached after empty before package\n"));

  // ignore these.
  EXPECT_TRUE(HasSpan(file_));
}